

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::ClearPartialCollect(Recycler *this)

{
  SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  Type pSVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Type buffer;
  
  bVar4 = DoQueueTrackedObject(this);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x10a1,"(!this->DoQueueTrackedObject())","!this->DoQueueTrackedObject()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  (this->autoHeap).unusedPartialCollectFreeBytes = 0;
  this->partialUncollectedAllocBytes = 0;
  pSVar1 = &this->clientTrackedObjectList;
  buffer = (this->clientTrackedObjectList).super_SListNodeBase<Memory::ArenaAllocator>.next;
  if ((SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)buffer != pSVar1) {
    do {
      pSVar2 = buffer->next;
      ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                (&(this->clientTrackedObjectAllocator).
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,buffer,
                 0x10);
      buffer = pSVar2;
    } while ((SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)pSVar2 != pSVar1);
  }
  (this->clientTrackedObjectList).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &pSVar1->super_SListNodeBase<Memory::ArenaAllocator>;
  (this->clientTrackedObjectList).super_RealCount.count = 0;
  this->uncollectedNewPageCountPartialCollect = 0xffffffffffffffff;
  return;
}

Assistant:

void
Recycler::ClearPartialCollect()
{
#if ENABLE_CONCURRENT_GC
    Assert(!this->DoQueueTrackedObject());
#endif
    this->autoHeap.unusedPartialCollectFreeBytes = 0;
    this->partialUncollectedAllocBytes = 0;
    this->clientTrackedObjectList.Clear(&this->clientTrackedObjectAllocator);
    this->uncollectedNewPageCountPartialCollect = (size_t)-1;
}